

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  stbi__context *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  stbi__uint32 sVar9;
  uint uVar10;
  int iVar11;
  stbi__jpeg *z;
  stbi__gif *g;
  void *pvVar12;
  long lVar13;
  char *pcVar14;
  char *__nptr;
  uint local_448;
  char *local_440;
  char buffer [1024];
  
  z = (stbi__jpeg *)malloc(0x4888);
  z->s = s;
  iVar7 = stbi__decode_jpeg_header(z,2);
  if (iVar7 == 0) {
    psVar1 = z->s;
    psVar1->img_buffer = psVar1->img_buffer_original;
    psVar1->img_buffer_end = psVar1->img_buffer_original_end;
  }
  else {
    if (x != (int *)0x0) {
      *x = z->s->img_x;
    }
    if (y != (int *)0x0) {
      *y = z->s->img_y;
    }
    if (comp != (int *)0x0) {
      *comp = (uint)(2 < z->s->img_n) * 2 + 1;
    }
  }
  free(z);
  if (iVar7 != 0) {
    return 1;
  }
  buffer._0_8_ = s;
  iVar7 = stbi__parse_png_file((stbi__png *)buffer,2,0);
  if (iVar7 != 0) {
    if (x != (int *)0x0) {
      *x = *(int *)buffer._0_8_;
    }
    if (y != (int *)0x0) {
      *y = *(int *)(buffer._0_8_ + 4);
    }
    if (comp == (int *)0x0) {
      return 1;
    }
    iVar8 = *(int *)(buffer._0_8_ + 8);
    goto LAB_00118945;
  }
  *(undefined8 *)(buffer._0_8_ + 0xb8) = *(undefined8 *)(buffer._0_8_ + 200);
  *(undefined8 *)(buffer._0_8_ + 0xc0) = *(undefined8 *)(buffer._0_8_ + 0xd0);
  g = (stbi__gif *)malloc(0x4860);
  iVar7 = stbi__gif_header(s,g,comp,1);
  if (iVar7 != 0) {
    if (x != (int *)0x0) {
      *x = g->w;
    }
    if (y != (int *)0x0) {
      *y = g->h;
    }
    free(g);
    return 1;
  }
  free(g);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  buffer[0x1c] = -1;
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  pvVar12 = stbi__bmp_parse_header(s,(stbi__bmp_data *)buffer);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (pvVar12 != (void *)0x0) {
    if (x != (int *)0x0) {
      *x = s->img_x;
    }
    if (y != (int *)0x0) {
      *y = s->img_y;
    }
    if (comp == (int *)0x0) {
      return 1;
    }
LAB_00118a1d:
    iVar8 = 4 - (uint)(buffer._24_4_ == 0);
LAB_00118945:
    *comp = iVar8;
    return 1;
  }
  sVar9 = stbi__get32be(s);
  if ((sVar9 == 0x38425053) && (iVar7 = stbi__get16be(s), iVar7 == 1)) {
    stbi__skip(s,6);
    uVar10 = stbi__get16be(s);
    if (uVar10 < 0x11) {
      sVar9 = stbi__get32be(s);
      if (y != (int *)0x0) {
        *y = sVar9;
      }
      sVar9 = stbi__get32be(s);
      if (x != (int *)0x0) {
        *x = sVar9;
      }
      iVar7 = stbi__get16be(s);
      if ((iVar7 == 8) && (iVar7 = stbi__get16be(s), iVar7 == 3)) {
        if (comp == (int *)0x0) {
          return 1;
        }
        *comp = 4;
        return 1;
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar7 = stbi__pic_is4(s,anon_var_dwarf_6f42d);
  if (iVar7 != 0) {
    stbi__skip(s,0x58);
    iVar7 = stbi__get16be(s);
    if (x != (int *)0x0) {
      *x = iVar7;
    }
    iVar11 = stbi__get16be(s);
    if (y != (int *)0x0) {
      *y = iVar11;
      iVar11 = iVar7;
    }
    iVar7 = stbi__at_eof(s);
    if (iVar7 == 0) {
      iVar7 = iVar11;
      if (x != (int *)0x0) {
        iVar7 = *x;
      }
      if (iVar7 != 0) {
        if (y != (int *)0x0) {
          iVar11 = *y;
        }
        if ((int)(0x10000000 / (long)iVar7) < iVar11) goto LAB_00118b0c;
      }
      stbi__skip(s,8);
      uVar10 = 0;
      iVar7 = 0xb;
      do {
        iVar7 = iVar7 + -1;
        if (iVar7 == 0) goto LAB_00118b1e;
        sVar3 = stbi__get8(s);
        sVar4 = stbi__get8(s);
        stbi__get8(s);
        bVar5 = stbi__get8(s);
        iVar11 = stbi__at_eof(s);
        if ((iVar11 != 0) || (sVar4 != '\b')) goto LAB_00118b0c;
        uVar10 = uVar10 | bVar5;
      } while (sVar3 != '\0');
      if (comp == (int *)0x0) {
        return 1;
      }
      buffer._24_4_ = uVar10 & 0x10;
      goto LAB_00118a1d;
    }
  }
LAB_00118b0c:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_00118b1e:
  iVar7 = stbi__pnm_info(s,x,y,comp);
  if (iVar7 != 0) {
    return 1;
  }
  iVar7 = stbi__hdr_test(s);
  if (iVar7 != 0) {
    bVar2 = false;
    while( true ) {
      stbi__hdr_gettoken(s,buffer);
      if (buffer[0] == '\0') break;
      iVar7 = bcmp(buffer,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar7 == 0) {
        bVar2 = true;
      }
    }
    if (bVar2) {
      stbi__hdr_gettoken(s,buffer);
      iVar7 = bcmp(buffer,"-Y ",3);
      if (iVar7 == 0) {
        local_440 = buffer + 3;
        lVar13 = strtol(local_440,&local_440,10);
        if (y != (int *)0x0) {
          *y = (int)lVar13;
        }
        __nptr = local_440 + 2;
        do {
          pcVar14 = __nptr;
          __nptr = pcVar14 + 1;
        } while (pcVar14[-2] == ' ');
        if (((pcVar14[-2] == '+') && (pcVar14[-1] == 'X')) && (*pcVar14 == ' ')) {
          local_440 = __nptr;
          lVar13 = strtol(__nptr,(char **)0x0,10);
          if (x != (int *)0x0) {
            *x = (int)lVar13;
          }
          if (comp != (int *)0x0) {
            *comp = 3;
          }
          return 1;
        }
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  stbi__get8(s);
  bVar5 = stbi__get8(s);
  if (1 < bVar5) goto LAB_00118cf8;
  bVar6 = stbi__get8(s);
  if (bVar5 == 1) {
    if ((bVar6 & 0xf7) != 1) goto LAB_00118cf8;
    iVar7 = 4;
    stbi__skip(s,4);
    bVar5 = stbi__get8(s);
    if ((0x20 < bVar5) ||
       (local_448 = (uint)bVar5, (0x101018100U >> ((ulong)bVar5 & 0x3f) & 1) == 0))
    goto LAB_00118cf8;
  }
  else {
    if ((bVar6 & 0xf6) != 2) goto LAB_00118cf8;
    local_448 = 0;
    iVar7 = 9;
  }
  stbi__skip(s,iVar7);
  iVar7 = stbi__get16le(s);
  if ((iVar7 != 0) && (iVar11 = stbi__get16le(s), iVar11 != 0)) {
    bVar5 = stbi__get8(s);
    stbi__get8(s);
    if (local_448 == 0) {
      local_448 = (uint)bVar5;
      uVar10 = (uint)((bVar6 & 0xf7) == 3);
    }
    else {
      if ((bVar5 != 0x10) && (bVar5 != 8)) goto LAB_00118cf8;
      uVar10 = 0;
    }
    iVar8 = stbi__tga_get_comp(local_448,uVar10,(int *)0x0);
    if (iVar8 != 0) {
      if (x != (int *)0x0) {
        *x = iVar7;
      }
      if (y != (int *)0x0) {
        *y = iVar11;
      }
      if (comp == (int *)0x0) {
        return 1;
      }
      goto LAB_00118945;
    }
  }
LAB_00118cf8:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  stbi__g_failure_reason = "unknown image type";
  return 0;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}